

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O2

CommandOptions * read_iab_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  uint uVar1;
  MDD_t MVar2;
  long *plVar3;
  undefined8 uVar4;
  long *plVar5;
  long lVar6;
  IFileReaderFactory *in_RDX;
  CommandOptions *pCVar7;
  uint uVar8;
  char *__ptr;
  size_t sStack_260;
  uint local_254;
  InterchangeObject *tmp_obj;
  CommandOptions *local_248;
  string *local_240;
  FrameBuffer FrameBuffer;
  uchar *local_230;
  uint local_220;
  string local_210 [104];
  MXFReader Reader;
  Result_t result;
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  local_248 = Options;
  AS_02::IAB::MXFReader::MXFReader(&Reader,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer(&FrameBuffer);
  local_254 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)&tmp_obj);
  local_240 = (string *)&result;
  AS_02::IAB::MXFReader::OpenRead(local_240);
  std::__cxx11::string::~string(local_210);
  if (_result < 0) {
LAB_0010a64f:
    for (uVar8 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
        (-1 < _result && (uVar8 < local_254)); uVar8 = uVar8 + 1) {
      AS_02::IAB::MXFReader::ReadFrame((uint)(Result_t *)local_210,(FrameBuffer *)&Reader);
      Kumu::Result_t::operator=(&result,(Result_t *)local_210);
      Kumu::Result_t::~Result_t((Result_t *)local_210);
      if ((-1 < _result) &&
         (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01')) {
        fprintf(_stdout,"Frame(%d):\n",(ulong)uVar8);
        uVar1 = *(uint *)&fileReaderFactory[1]._vptr_IFileReaderFactory;
        if (local_220 < *(uint *)&fileReaderFactory[1]._vptr_IFileReaderFactory) {
          uVar1 = local_220;
        }
        Kumu::hexdump(local_230,uVar1,_stdout);
      }
    }
  }
  else {
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
    }
    tmp_obj = (InterchangeObject *)0x0;
    plVar3 = (long *)AS_02::IAB::MXFReader::OP1aHeader();
    MVar2 = ASDCP::DefaultCompositeDict();
    uVar4 = ASDCP::Dictionary::Type(MVar2);
    (**(code **)(*plVar3 + 0xa8))(local_210,plVar3,uVar4,&tmp_obj);
    Kumu::Result_t::operator=(&result,(Result_t *)local_210);
    Kumu::Result_t::~Result_t((Result_t *)local_210);
    if (_result < 0) goto LAB_0010a64f;
    if ((tmp_obj == (InterchangeObject *)0x0) ||
       (plVar3 = (long *)__dynamic_cast(tmp_obj,&ASDCP::MXF::InterchangeObject::typeinfo,
                                        &ASDCP::MXF::IABEssenceDescriptor::typeinfo,0),
       plVar3 == (long *)0x0)) {
      __ptr = "File does not contain an essence descriptor.\n";
      sStack_260 = 0x2d;
LAB_0010a84a:
      fwrite(__ptr,sStack_260,1,_stderr);
      Kumu::Result_t::Result_t((Result_t *)local_248,(Result_t *)&Kumu::RESULT_FAIL);
      pCVar7 = local_248;
      goto LAB_0010a8a5;
    }
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      (**(code **)(*plVar3 + 0x88))(plVar3,0);
    }
    lVar6 = plVar3[0x1f];
    if (lVar6 == 0) {
      fwrite("ContainerDuration not set in file descriptor, attempting to use index duration.\n",
             0x50,1,_stderr);
      AS_02::IAB::MXFReader::GetFrameCount((uint *)local_98);
      Kumu::Result_t::~Result_t(local_98);
      lVar6 = 0;
    }
    else {
      local_254 = (uint)lVar6;
    }
    if ((int)lVar6 == 0) {
      fwrite("ContainerDuration not set in index, attempting to use Duration from SourceClip.\n",
             0x50,1,_stderr);
      plVar5 = (long *)AS_02::IAB::MXFReader::OP1aHeader();
      MVar2 = ASDCP::DefaultCompositeDict();
      uVar4 = ASDCP::Dictionary::Type(MVar2);
      (**(code **)(*plVar5 + 0xa8))(local_210,plVar5,uVar4,&tmp_obj);
      Kumu::Result_t::operator=(&result,(Result_t *)local_210);
      Kumu::Result_t::~Result_t((Result_t *)local_210);
      if ((-1 < _result) &&
         (lVar6 = __dynamic_cast(tmp_obj,&ASDCP::MXF::InterchangeObject::typeinfo,
                                 &ASDCP::MXF::SourceClip::typeinfo,0),
         *(char *)(lVar6 + 200) != '\0')) {
        local_254 = *(uint *)(lVar6 + 0xc0);
      }
    }
    if (local_254 == 0) {
      __ptr = "Unable to determine file duration.\n";
      sStack_260 = 0x23;
      goto LAB_0010a84a;
    }
    ASDCP::FrameBuffer::Capacity((uint)local_100);
    Kumu::Result_t::~Result_t(local_100);
    local_254 = *(uint *)(plVar3 + 0x1f);
    if (_result < 0) goto LAB_0010a64f;
    uVar8 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
    if ((uVar8 != 0) && (uVar8 < local_254)) {
      local_254 = uVar8;
    }
    uVar8 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
    if (uVar8 == 0) {
LAB_0010a649:
      local_254 = local_254 - uVar8;
      goto LAB_0010a64f;
    }
    if (uVar8 <= local_254) {
      if (local_254 + uVar8 < local_254) {
        local_254 = local_254 + uVar8;
      }
      goto LAB_0010a649;
    }
    fwrite("Start value greater than file duration.\n",0x28,1,_stderr);
    local_240 = (string *)&Kumu::RESULT_FAIL;
  }
  pCVar7 = local_248;
  Kumu::Result_t::Result_t((Result_t *)local_248,(Result_t *)local_240);
LAB_0010a8a5:
  Kumu::Result_t::~Result_t(&result);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer);
  AS_02::IAB::MXFReader::~MXFReader(&Reader);
  return pCVar7;
}

Assistant:

Result_t read_iab_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
    AESDecContext*     Context = 0;
    HMACContext*       HMAC = 0;
    AS_02::IAB::MXFReader Reader(fileReaderFactory);
    ASDCP::FrameBuffer   FrameBuffer;

    ui32_t last_frame = 0;
    ASDCP::MXF::IABEssenceDescriptor *iab_descriptor = 0;

    Result_t result = Reader.OpenRead(Options.input_filename);

    if ( KM_SUCCESS(result) )
    {
        if ( Options.verbose_flag )
        {
            fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
        }

        ASDCP::MXF::InterchangeObject* tmp_obj = 0;

        result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_IABEssenceDescriptor), &tmp_obj);

        if ( KM_SUCCESS(result) )
        {
            iab_descriptor = dynamic_cast<ASDCP::MXF::IABEssenceDescriptor*>(tmp_obj);

            if ( iab_descriptor == 0 )
            {
                fprintf(stderr, "File does not contain an essence descriptor.\n");
                return RESULT_FAIL;
            }

            if ( Options.verbose_flag )
            {
                iab_descriptor->Dump();
            }

            if ( iab_descriptor->ContainerDuration.get() == 0 )
            {
                fprintf(stderr, "ContainerDuration not set in file descriptor, attempting to use index duration.\n");
                Reader.GetFrameCount(last_frame);
            }
            else
            {
                last_frame = (ui32_t)iab_descriptor->ContainerDuration;
            }

            if ( last_frame == 0 )
            {
                fprintf(stderr, "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n");
                result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_SourceClip), &tmp_obj);
                if ( KM_SUCCESS(result))
                {
                    ASDCP::MXF::SourceClip *sourceClip = dynamic_cast<ASDCP::MXF::SourceClip*>(tmp_obj);
                    if ( ! sourceClip->Duration.empty() )
                    {
                        last_frame = (ui32_t)sourceClip->Duration;
                    }
                }
            }

            if ( last_frame == 0 )
            {
                fprintf(stderr, "Unable to determine file duration.\n");
                return RESULT_FAIL;
            }

            assert(iab_descriptor);
            FrameBuffer.Capacity(24000); // TODO what size?
            last_frame = (ui32_t)iab_descriptor->ContainerDuration;
        }
    }

    if ( ASDCP_SUCCESS(result) )
    {
        if ( Options.duration > 0 && Options.duration < last_frame )
            last_frame = Options.duration;

        if ( Options.start_frame > 0 )
        {
            if ( Options.start_frame > last_frame )
            {
                fprintf(stderr, "Start value greater than file duration.\n");
                return RESULT_FAIL;
            }

            last_frame = Kumu::xmin(Options.start_frame + last_frame, last_frame);
        }

        last_frame = last_frame - Options.start_frame;


    }

    for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
        result = Reader.ReadFrame(i, FrameBuffer);

        if ( ASDCP_SUCCESS(result) )
        {
            if ( Options.verbose_flag )
            {
                FrameBuffer.FrameNumber(i);
                fprintf(stdout, "Frame(%d):\n", i);
                Kumu::hexdump(FrameBuffer.RoData(), Kumu::xmin(FrameBuffer.Size(), (ui32_t)Options.fb_dump_size), stdout);
            }
        }
    }

    return result;
}